

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall Assimp::IFC::TempMesh::FixupFaceOrientation(TempMesh *this)

{
  allocator<unsigned_long> *this_00;
  uint uVar1;
  value_type vVar2;
  value_type vVar3;
  unsigned_long uVar4;
  double dVar5;
  aiVector3t<double> __init;
  aiVector3t<double> __init_00;
  FindVector __pred;
  pointer puVar6;
  size_t sVar7;
  bool bVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  mapped_type *pmVar13;
  mapped_type *this_01;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  difference_type dVar14;
  reference puVar15;
  difference_type dVar16;
  IfcFloat IVar17;
  aiVector3t<double> *paVar18;
  reference pvVar19;
  difference_type dVar20;
  reference b_00;
  iterator iVar21;
  reference rVar22;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_651;
  reference local_510;
  undefined1 *local_500;
  size_t a_6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4f0;
  unsigned_long *local_4e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4e0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4d8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_4d0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_4c8;
  aiVector3t<double> *local_4c0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_4b8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_4b0;
  FuzzyVectorCompare local_4a8;
  ulong local_4a0;
  size_t oursideidx;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_490;
  aiVector3t<double> *local_488;
  ulong local_480;
  size_t nb_vidx;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_470;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_468;
  FindVector local_460;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_448;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_440;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_438;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_430;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_428;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_420;
  iterator it;
  size_t nbvc;
  size_t nbvsi;
  IfcVector3 *vp;
  _Bit_type local_3f8;
  size_type local_3f0;
  size_t nbi;
  size_t a_5;
  size_t vc;
  size_t vsi;
  size_t tdf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> todo;
  ulong local_3a0;
  size_t a_4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_390;
  unsigned_long *local_388;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_380;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_378;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_370;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_368;
  aiVector3t<double> *local_360;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_358;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_350;
  ulong local_348;
  size_t fvc;
  size_t fsi;
  aiVector3t<double> local_320;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_308;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_300;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2f8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2f0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2e8;
  aiVector3t<double> local_2e0;
  undefined1 local_2c8 [8];
  IfcVector3 farthestCenter;
  IfcVector3 farthestNormal;
  IfcFloat dst;
  double dStack_270;
  double local_268;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_260;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_258;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_250;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_248;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_240;
  aiVector3t<double> local_238;
  undefined1 local_220 [8];
  IfcVector3 faceCenter;
  IfcFloat local_1f8;
  size_t a_3;
  IfcFloat farthestDistance;
  size_t farthestIndex;
  _Bit_type *local_1d8;
  uint local_1d0;
  _Bit_type *local_1c8;
  uint local_1c0;
  _Bit_type *local_1b8;
  uint local_1b0;
  _Bit_type *local_1a8;
  uint local_1a0;
  allocator<bool> local_192;
  bool local_191;
  undefined1 local_190 [8];
  vector<bool,_std::allocator<bool>_> faceDone;
  iterator sectend;
  iterator sectstart;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *facesOnNB;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *facesOnB;
  size_t nib;
  size_t ib;
  size_t b_1;
  size_t a_2;
  undefined1 local_e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tempIntersect;
  value_type_conflict3 local_c8;
  undefined1 local_c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbour;
  size_t b;
  size_t a_1;
  map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  facesByVertex;
  size_t a;
  size_t i;
  allocator<unsigned_long> local_41;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceStartIndices;
  IfcVector3 vavg;
  TempMesh *this_local;
  
  Center((IfcVector3 *)
         &faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage,this);
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt);
  std::allocator<unsigned_long>::allocator(&local_41);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,sVar9,&local_41);
  std::allocator<unsigned_long>::~allocator(&local_41);
  a = 0;
  for (facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar7 = facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count,
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt),
      sVar7 < sVar9;
      facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count =
           facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                         facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count);
    *pvVar10 = a;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->mVertcnt,
                         facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count);
    a = *pvVar11 + a;
  }
  std::
  map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::map((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
         *)&a_1);
  for (b = 0; sVar7 = b,
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt),
      sVar7 < sVar9; b = b + 1) {
    for (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar6 = neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->mVertcnt,b), puVar6 < (pointer)(ulong)*pvVar11;
        neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)neighbour.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,b);
      pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                          (&this->mVerts,
                           *pvVar10 +
                           (long)neighbour.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pmVar13 = std::
                map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&a_1,pvVar12);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pmVar13,&b);
    }
  }
  sVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size(&this->mVerts)
  ;
  local_c8 = 0xffffffffffffffff;
  this_00 = (allocator<unsigned_long> *)
            ((long)&tempIntersect.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,sVar9,&local_c8,
             this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&tempIntersect.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&a_2 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,10,
             (allocator<unsigned_long> *)((long)&a_2 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&a_2 + 7));
  for (b_1 = 0; sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                  (&this->mVertcnt), b_1 < sVar9; b_1 = b_1 + 1) {
    for (ib = 0; pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                     (&this->mVertcnt,b_1), ib < *pvVar11; ib = ib + 1) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,b_1);
      vVar2 = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,b_1);
      vVar3 = *pvVar10;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->mVertcnt,b_1);
      uVar1 = *pvVar11;
      pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                          (&this->mVerts,vVar2 + ib);
      pmVar13 = std::
                map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&a_1,pvVar12);
      pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                          (&this->mVerts,vVar3 + (ib + 1) % (ulong)uVar1);
      this_01 = std::
                map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&a_1,pvVar12);
      sectend = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
      __first1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pmVar13);
      __last1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pmVar13);
      __first2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
      __last2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
      faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           (_Bit_pointer)
           std::
           set_intersection<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                     ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )__first1._M_current,
                      (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )__last1._M_current,
                      (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )__first2._M_current,
                      (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )__last2._M_current,
                      (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )sectend._M_current);
      dVar14 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )sectend._M_current,
                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
      if (dVar14 == 2) {
        puVar15 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&sectend);
        if (*puVar15 == b_1) {
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&sectend);
        }
        puVar15 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&sectend);
        uVar4 = *puVar15;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                             vVar2 + ib);
        *pvVar10 = uVar4;
      }
    }
  }
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt);
  local_191 = false;
  std::allocator<bool>::allocator(&local_192);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_190,sVar9,&local_191,&local_192);
  std::allocator<bool>::~allocator(&local_192);
  do {
    iVar21 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)local_190);
    local_1b8 = iVar21.super__Bit_iterator_base._M_p;
    local_1b0 = iVar21.super__Bit_iterator_base._M_offset;
    local_1a8 = local_1b8;
    local_1a0 = local_1b0;
    iVar21 = std::vector<bool,_std::allocator<bool>_>::end
                       ((vector<bool,_std::allocator<bool>_> *)local_190);
    local_1d8 = iVar21.super__Bit_iterator_base._M_p;
    local_1d0 = iVar21.super__Bit_iterator_base._M_offset;
    farthestIndex._7_1_ = 0;
    __first.super__Bit_iterator_base._M_offset = local_1a0;
    __first.super__Bit_iterator_base._M_p = local_1a8;
    __first.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar21.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(iVar21.super__Bit_iterator_base._0_12_,8);
    local_1c8 = local_1d8;
    local_1c0 = local_1d0;
    dVar16 = std::count<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&farthestIndex + 7));
    if (dVar16 == 0) {
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_190);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
      std::
      map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~map((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&a_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      return;
    }
    farthestDistance = -NAN;
    a_3 = 0xbff0000000000000;
    local_1f8 = 0.0;
    while( true ) {
      IVar17 = (IfcFloat)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->mVertcnt);
      if ((ulong)IVar17 <= (ulong)local_1f8) break;
      rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_190,(size_type)local_1f8);
      faceCenter.z = (double)rVar22._M_p;
      bVar8 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&faceCenter.z);
      if (!bVar8) {
        local_248._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&this->mVerts);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                             (size_type)local_1f8);
        local_240 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator+(&local_248,*pvVar10);
        local_260._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                       (&this->mVerts);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                             (size_type)local_1f8);
        local_258 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator+(&local_260,*pvVar10);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->mVertcnt,(size_type)local_1f8);
        local_250 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator+(&local_258,(ulong)*pvVar11);
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&dst,0.0);
        __init.y = dStack_270;
        __init.x = dst;
        __init.z = local_268;
        std::
        accumulate<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,aiVector3t<double>>
                  (&local_238,local_240,local_250,__init);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&this->mVertcnt,(size_type)local_1f8);
        ::operator/((aiVector3t<double> *)local_220,&local_238,(double)*pvVar11);
        ::operator-((aiVector3t<double> *)&farthestNormal.z,(aiVector3t<double> *)local_220,
                    (aiVector3t<double> *)
                    &faceStartIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        dVar5 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&farthestNormal.z);
        if ((double)a_3 < dVar5) {
          farthestDistance = local_1f8;
          a_3 = (size_t)dVar5;
        }
      }
      local_1f8 = (IfcFloat)((long)local_1f8 + 1);
    }
    paVar18 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data
                        (&this->mVerts);
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                         (size_type)farthestDistance);
    vVar2 = *pvVar10;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->mVertcnt,(size_type)farthestDistance);
    ComputePolygonNormal((IfcVector3 *)&farthestCenter.z,paVar18 + vVar2,(ulong)*pvVar11,true);
    local_2f0._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin(&this->mVerts)
    ;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                         (size_type)farthestDistance);
    local_2e8 = __gnu_cxx::
                __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                ::operator+(&local_2f0,*pvVar10);
    local_308._M_current =
         (aiVector3t<double> *)
         std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin(&this->mVerts)
    ;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                         (size_type)farthestDistance);
    local_300 = __gnu_cxx::
                __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                ::operator+(&local_308,*pvVar10);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->mVertcnt,(size_type)farthestDistance);
    local_2f8 = __gnu_cxx::
                __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                ::operator+(&local_300,(ulong)*pvVar11);
    aiVector3t<double>::aiVector3t(&local_320,0.0);
    __init_00.y = local_320.y;
    __init_00.x = local_320.x;
    __init_00.z = local_320.z;
    std::
    accumulate<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,aiVector3t<double>>
              (&local_2e0,local_2e8,local_2f8,__init_00);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->mVertcnt,(size_type)farthestDistance);
    ::operator/((aiVector3t<double> *)local_2c8,&local_2e0,(double)*pvVar11);
    ::operator-((aiVector3t<double> *)&fsi,(aiVector3t<double> *)local_2c8,
                (aiVector3t<double> *)
                &faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    paVar18 = aiVector3t<double>::Normalize((aiVector3t<double> *)&fsi);
    dVar5 = ::operator*((aiVector3t<double> *)&farthestCenter.z,paVar18);
    if (dVar5 < -0.4) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                           (size_type)farthestDistance);
      fvc = *pvVar10;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->mVertcnt,(size_type)farthestDistance);
      local_348 = (ulong)*pvVar11;
      local_358._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     (&this->mVerts);
      local_350 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator+(&local_358,fvc);
      local_370._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     (&this->mVerts);
      local_368 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator+(&local_370,fvc);
      local_360 = (aiVector3t<double> *)
                  __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator+(&local_368,local_348);
      std::
      reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                (local_350,
                 (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  )local_360);
      local_380._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
      local_378 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&local_380,fvc);
      a_4 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
      local_390 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&a_4,fvc);
      local_388 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&local_390,local_348);
      std::
      reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (local_378,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_388);
      for (local_3a0 = 0; local_3a0 < local_348 - 1; local_3a0 = local_3a0 + 1) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                             fvc + local_3a0);
        pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                             fvc + local_3a0 + 1);
        std::swap<unsigned_long>(pvVar10,pvVar19);
      }
    }
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_190,(size_type)farthestDistance
                       );
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = rVar22._M_p;
    std::_Bit_reference::operator=
              ((_Bit_reference *)
               &todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,true);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf,
               (value_type_conflict3 *)&farthestDistance);
    while( true ) {
      bVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf);
      if (((bVar8 ^ 0xffU) & 1) == 0) break;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf);
      vsi = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,vsi);
      vc = *pvVar10;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->mVertcnt,vsi);
      a_5 = (size_t)*pvVar11;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf);
      for (nbi = 0; nbi < a_5; nbi = nbi + 1) {
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                             vc + nbi);
        local_3f0 = *pvVar10;
        local_651 = true;
        if (local_3f0 != 0xffffffffffffffff) {
          rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_190,local_3f0);
          local_3f8 = rVar22._M_mask;
          vp = (IfcVector3 *)rVar22._M_p;
          local_651 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&vp);
        }
        if (local_651 == false) {
          pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[](&this->mVerts,vc + nbi);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                               local_3f0);
          vVar2 = *pvVar10;
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&this->mVertcnt,local_3f0);
          it._M_current = (aiVector3t<double> *)(ulong)*pvVar11;
          local_430._M_current =
               (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                         (&this->mVerts);
          local_428 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+(&local_430,vVar2);
          local_448._M_current =
               (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                         (&this->mVerts);
          local_440 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+(&local_448,vVar2);
          local_438 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+(&local_440,it._M_current);
          FindVector::FindVector(&local_460,pvVar12);
          __pred.v.y = local_460.v.y;
          __pred.v.x = local_460.v.x;
          __pred.v.z = local_460.v.z;
          local_420 = std::
                      find_if<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,Assimp::IFC::FindVector>
                                (local_428,local_438,__pred);
          nb_vidx = (size_t)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                            begin(&this->mVerts);
          local_470 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                   *)&nb_vidx,vVar2);
          local_468 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+(&local_470,it._M_current);
          bVar8 = __gnu_cxx::operator!=(&local_420,&local_468);
          if (!bVar8) {
            __assert_fail("it != mVerts.begin() + nbvsi + nbvc",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCUtil.cpp"
                          ,0x162,"void Assimp::IFC::TempMesh::FixupFaceOrientation()");
          }
          local_490._M_current =
               (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                         (&this->mVerts);
          local_488 = (aiVector3t<double> *)
                      __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator+(&local_490,vVar2);
          oursideidx = (size_t)local_420._M_current;
          dVar20 = std::
                   distance<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                             ((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                               )local_488,local_420);
          local_480 = (dVar20 + 1U) % (ulong)it._M_current;
          local_4a0 = (nbi + 1) % a_5;
          FuzzyVectorCompare::FuzzyVectorCompare(&local_4a8,1e-06);
          pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[](&this->mVerts,vc + local_4a0);
          b_00 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                           (&this->mVerts,vVar2 + local_480);
          bVar8 = FuzzyVectorCompare::operator()(&local_4a8,pvVar12,b_00);
          if (bVar8) {
            local_4b8._M_current =
                 (aiVector3t<double> *)
                 std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                           (&this->mVerts);
            local_4b0 = __gnu_cxx::
                        __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        ::operator+(&local_4b8,vVar2);
            local_4d0._M_current =
                 (aiVector3t<double> *)
                 std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                           (&this->mVerts);
            local_4c8 = __gnu_cxx::
                        __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        ::operator+(&local_4d0,vVar2);
            local_4c0 = (aiVector3t<double> *)
                        __gnu_cxx::
                        __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        ::operator+(&local_4c8,it._M_current);
            std::
            reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                      (local_4b0,
                       (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                        )local_4c0);
            local_4e0._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
            local_4d8 = __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&local_4e0,vVar2);
            a_6 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_c0);
            local_4f0 = __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&a_6,vVar2);
            local_4e8 = (unsigned_long *)
                        __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&local_4f0,(difference_type)it._M_current);
            std::
            reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (local_4d8,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_4e8);
            for (local_500 = (undefined1 *)0x0;
                local_500 < (undefined1 *)((long)&it._M_current[-1].z + 7U);
                local_500 = local_500 + 1) {
              pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0
                                   ,(size_type)(local_500 + vVar2));
              pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0
                                   ,(size_type)(local_500 + vVar2 + 1));
              std::swap<unsigned_long>(pvVar10,pvVar19);
            }
          }
          rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_190,local_3f0);
          local_510 = rVar22;
          std::_Bit_reference::operator=(&local_510,true);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf,&local_3f0);
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&tdf);
  } while( true );
}

Assistant:

void TempMesh::FixupFaceOrientation()
{
    const IfcVector3 vavg = Center();

    // create a list of start indices for all faces to allow random access to faces
    std::vector<size_t> faceStartIndices(mVertcnt.size());
    for( size_t i = 0, a = 0; a < mVertcnt.size(); i += mVertcnt[a], ++a )
        faceStartIndices[a] = i;

    // list all faces on a vertex
    std::map<IfcVector3, std::vector<size_t>, CompareVector> facesByVertex;
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
            facesByVertex[mVerts[faceStartIndices[a] + b]].push_back(a);
    }
    // determine neighbourhood for all polys
    std::vector<size_t> neighbour(mVerts.size(), SIZE_MAX);
    std::vector<size_t> tempIntersect(10);
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
        {
            size_t ib = faceStartIndices[a] + b, nib = faceStartIndices[a] + (b + 1) % mVertcnt[a];
            const std::vector<size_t>& facesOnB = facesByVertex[mVerts[ib]];
            const std::vector<size_t>& facesOnNB = facesByVertex[mVerts[nib]];
            // there should be exactly one or two faces which appear in both lists. Our face and the other side
            std::vector<size_t>::iterator sectstart = tempIntersect.begin();
            std::vector<size_t>::iterator sectend = std::set_intersection(
                facesOnB.begin(), facesOnB.end(), facesOnNB.begin(), facesOnNB.end(), sectstart);

            if( std::distance(sectstart, sectend) != 2 )
                continue;
            if( *sectstart == a )
                ++sectstart;
            neighbour[ib] = *sectstart;
        }
    }

    // now we're getting started. We take the face which is the farthest away from the center. This face is most probably
    // facing outwards. So we reverse this face to point outwards in relation to the center. Then we adapt neighbouring
    // faces to have the same winding until all faces have been tested.
    std::vector<bool> faceDone(mVertcnt.size(), false);
    while( std::count(faceDone.begin(), faceDone.end(), false) != 0 )
    {
        // find the farthest of the remaining faces
        size_t farthestIndex = SIZE_MAX;
        IfcFloat farthestDistance = -1.0;
        for( size_t a = 0; a < mVertcnt.size(); ++a )
        {
            if( faceDone[a] )
                continue;
            IfcVector3 faceCenter = std::accumulate(mVerts.begin() + faceStartIndices[a],
                mVerts.begin() + faceStartIndices[a] + mVertcnt[a], IfcVector3(0.0)) / IfcFloat(mVertcnt[a]);
            IfcFloat dst = (faceCenter - vavg).SquareLength();
            if( dst > farthestDistance ) { farthestDistance = dst; farthestIndex = a; }
        }

        // calculate its normal and reverse the poly if its facing towards the mesh center
        IfcVector3 farthestNormal = ComputePolygonNormal(mVerts.data() + faceStartIndices[farthestIndex], mVertcnt[farthestIndex]);
        IfcVector3 farthestCenter = std::accumulate(mVerts.begin() + faceStartIndices[farthestIndex],
            mVerts.begin() + faceStartIndices[farthestIndex] + mVertcnt[farthestIndex], IfcVector3(0.0))
            / IfcFloat(mVertcnt[farthestIndex]);
        // We accept a bit of negative orientation without reversing. In case of doubt, prefer the orientation given in
        // the file.
        if( (farthestNormal * (farthestCenter - vavg).Normalize()) < -0.4 )
        {
            size_t fsi = faceStartIndices[farthestIndex], fvc = mVertcnt[farthestIndex];
            std::reverse(mVerts.begin() + fsi, mVerts.begin() + fsi + fvc);
            std::reverse(neighbour.begin() + fsi, neighbour.begin() + fsi + fvc);
            // because of the neighbour index belonging to the edge starting with the point at the same index, we need to
            // cycle the neighbours through to match the edges again.
            // Before: points A - B - C - D with edge neighbour p - q - r - s
            // After: points D - C - B - A, reversed neighbours are s - r - q - p, but the should be
            //                r   q   p   s
            for( size_t a = 0; a < fvc - 1; ++a )
                std::swap(neighbour[fsi + a], neighbour[fsi + a + 1]);
        }
        faceDone[farthestIndex] = true;
        std::vector<size_t> todo;
        todo.push_back(farthestIndex);

        // go over its neighbour faces recursively and adapt their winding order to match the farthest face
        while( !todo.empty() )
        {
            size_t tdf = todo.back();
            size_t vsi = faceStartIndices[tdf], vc = mVertcnt[tdf];
            todo.pop_back();

            // check its neighbours
            for( size_t a = 0; a < vc; ++a )
            {
                // ignore neighbours if we already checked them
                size_t nbi = neighbour[vsi + a];
                if( nbi == SIZE_MAX || faceDone[nbi] )
                    continue;

                const IfcVector3& vp = mVerts[vsi + a];
                size_t nbvsi = faceStartIndices[nbi], nbvc = mVertcnt[nbi];
                std::vector<IfcVector3>::iterator it = std::find_if(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc, FindVector(vp));
                ai_assert(it != mVerts.begin() + nbvsi + nbvc);
                size_t nb_vidx = std::distance(mVerts.begin() + nbvsi, it);
                // two faces winded in the same direction should have a crossed edge, where one face has p0->p1 and the other
                // has p1'->p0'. If the next point on the neighbouring face is also the next on the current face, we need
                // to reverse the neighbour
                nb_vidx = (nb_vidx + 1) % nbvc;
                size_t oursideidx = (a + 1) % vc;
                if( FuzzyVectorCompare(1e-6)(mVerts[vsi + oursideidx], mVerts[nbvsi + nb_vidx]) )
                {
                    std::reverse(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc);
                    std::reverse(neighbour.begin() + nbvsi, neighbour.begin() + nbvsi + nbvc);
                    for( size_t a = 0; a < nbvc - 1; ++a )
                        std::swap(neighbour[nbvsi + a], neighbour[nbvsi + a + 1]);
                }

                // either way we're done with the neighbour. Mark it as done and continue checking from there recursively
                faceDone[nbi] = true;
                todo.push_back(nbi);
            }
        }

        // no more faces reachable from this part of the surface, start over with a disjunct part and its farthest face
    }
}